

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O1

ll128 * __thiscall Constant::Util::power(ll128 *__return_storage_ptr__,Util *this,ll128 a,ll128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ll128 *plVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar7 = __modti3();
  auVar7 = __umodti3(auVar7._0_8_ + 0x16345785d8a0003,
                     auVar7._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar7._0_8_),0x16345785d8a0003,0);
  if (auVar7._0_8_ == 0 && auVar7._8_8_ == 0) {
    plVar4 = (ll128 *)0x1;
  }
  else {
    auVar8 = __modti3(__return_storage_ptr__,this,0x16345785d8a0003,0);
    auVar10 = ZEXT816(1);
    do {
      lVar6 = auVar7._8_8_;
      uVar5 = auVar7._0_8_;
      auVar9 = __umodti3(auVar8._0_8_ + 0x16345785d8a0003,
                         auVar8._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar8._0_8_),0x16345785d8a0003
                         ,0);
      uVar3 = auVar9._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar10._0_8_;
      if ((auVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar8 = auVar9 * auVar10;
      }
      auVar8 = __umodti3(auVar8._0_8_,auVar8._8_8_,0x16345785d8a0003,0);
      auVar10 = __umodti3(auVar8._0_8_ + 0x16345785d8a0003,
                          auVar8._8_8_ + (ulong)(0xfe9cba87a275fffc < auVar8._0_8_),
                          0x16345785d8a0003);
      plVar4 = auVar10._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar3;
      auVar8 = __umodti3(SUB168(auVar1 * auVar2,0),
                         auVar9._8_8_ * uVar3 * 2 + SUB168(auVar1 * auVar2,8),0x16345785d8a0003);
      auVar7 = auVar7 >> 1;
    } while (lVar6 != 0 || (ulong)-lVar6 < (ulong)(1 < uVar5));
  }
  return plVar4;
}

Assistant:

ll128 Constant::Util::power(ll128 a, ll128 b) {
    ll128 ret = 1;
    a = (a%MOD+MOD)%MOD;
    b = (b%MOD+MOD)%MOD;
    if (b == 0)
        return 1;
    while (b > 0) {
        if (b&1) ret = ret * a;
        ret = get_residual(ret);
        a = a * a;
        a = get_residual(a);
        b >>= 1;
    }
    return ret;
}